

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  DescriptorBuilder *this_01;
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  Type TVar6;
  UninterpretedOption_NamePart *pUVar7;
  string *psVar8;
  Descriptor *pDVar9;
  long lVar10;
  ulong uVar11;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar12;
  reference ppFVar13;
  LogMessage *pLVar14;
  undefined4 extraout_var_00;
  UnknownFieldSet *pUVar15;
  Symbol SVar16;
  byte local_56a;
  LogFinisher local_491;
  LogMessage local_490;
  LogFinisher local_452;
  byte local_451;
  LogMessage local_450;
  undefined1 local_418 [8];
  CodedOutputStream out;
  StringOutputStream outstr;
  scoped_ptr<google::protobuf::UnknownFieldSet> parent_unknown_fields;
  reverse_iterator iter;
  scoped_ptr<google::protobuf::UnknownFieldSet> unknown_fields;
  const_iterator local_3c0;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_3b8;
  const_iterator local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  int local_184;
  Type local_180;
  undefined4 uStack_17c;
  anon_union_8_8_13f84498_for_Symbol_2 aStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string *local_130;
  string *name_part;
  int i;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  FieldDescriptor *field;
  Descriptor *descriptor;
  LogMessage local_d0;
  undefined1 auStack_98 [8];
  Symbol symbol;
  Descriptor *options_descriptor;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Message *local_20;
  Message *options_local;
  OptionInterpreter *this_local;
  
  local_20 = options;
  options_local = (Message *)this;
  iVar3 = UninterpretedOption::name_size(this->uninterpreted_option_);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Option must have a name.",&local_41);
    this_local._7_1_ = AddNameError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    pUVar7 = UninterpretedOption::name(this->uninterpreted_option_,0);
    psVar8 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar7);
    bVar2 = std::operator==(psVar8,"uninterpreted_option");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Option must not use reserved name \"uninterpreted_option\".",
                 (allocator<char> *)((long)&options_descriptor + 7));
      this_local._7_1_ = AddNameError(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&options_descriptor + 7));
    }
    else {
      symbol.field_1.descriptor = (Descriptor *)0x0;
      this_01 = this->builder_;
      pDVar9 = Message::GetDescriptor(local_20);
      psVar8 = Descriptor::full_name_abi_cxx11_(pDVar9);
      SVar16 = FindSymbolNotEnforcingDeps(this_01,psVar8,true);
      symbol._0_8_ = SVar16.field_1;
      auStack_98._0_4_ = SVar16.type;
      bVar2 = Symbol::IsNull((Symbol *)auStack_98);
      if ((bVar2) || (auStack_98._0_4_ != MESSAGE)) {
        symbol.field_1.descriptor = Message::GetDescriptor(local_20);
      }
      else {
        symbol.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)symbol._0_8_;
      }
      descriptor._7_1_ = 0;
      if (symbol.field_1.descriptor == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_d0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1797);
        descriptor._7_1_ = 1;
        pLVar14 = internal::LogMessage::operator<<(&local_d0,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&descriptor + 6),pLVar14);
      }
      if ((descriptor._7_1_ & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_d0);
      }
      field = symbol.field_1.field_descriptor;
      intermediate_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)((long)&debug_msg_name.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"",(allocator<char> *)((long)&name_part + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&name_part + 7));
      for (name_part._0_4_ = 0; iVar3 = (int)name_part,
          iVar4 = UninterpretedOption::name_size(this->uninterpreted_option_), iVar3 < iVar4;
          name_part._0_4_ = (int)name_part + 1) {
        pUVar7 = UninterpretedOption::name(this->uninterpreted_option_,(int)name_part);
        local_130 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar7);
        lVar10 = std::__cxx11::string::size();
        if (lVar10 != 0) {
          std::__cxx11::string::operator+=((string *)&i,".");
        }
        pUVar7 = UninterpretedOption::name(this->uninterpreted_option_,(int)name_part);
        bVar2 = UninterpretedOption_NamePart::is_extension(pUVar7);
        if (bVar2) {
          std::operator+(&local_170,"(",local_130);
          std::operator+(&local_150,&local_170,")");
          std::__cxx11::string::operator+=((string *)&i,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          SVar16 = LookupSymbol(this->builder_,local_130,&this->options_to_interpret_->name_scope,
                                PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
          aStack_178 = SVar16.field_1;
          local_180 = SVar16.type;
          auStack_98._4_4_ = uStack_17c;
          auStack_98._0_4_ = local_180;
          symbol._0_8_ = aStack_178;
          bVar2 = Symbol::IsNull((Symbol *)auStack_98);
          if ((!bVar2) && (auStack_98._0_4_ == FIELD)) {
            intermediate_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)symbol._0_8_;
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)&i,(string *)local_130);
          intermediate_fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)Descriptor::FindFieldByName((Descriptor *)field,local_130);
        }
        if (intermediate_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
          bVar2 = get_allow_unknown(this->builder_->pool_);
          if (bVar2) {
            AddWithoutInterpreting(this,this->uninterpreted_option_,local_20);
            this_local._7_1_ = 1;
            local_184 = 1;
          }
          else {
            uVar11 = std::__cxx11::string::empty();
            if ((uVar11 & 1) == 0) {
              std::operator+(&local_248,"Option \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                            );
              std::operator+(&local_228,&local_248,"\" is resolved to \"(");
              std::operator+(&local_208,&local_228,&this->builder_->undefine_resolved_name_);
              std::operator+(&local_1e8,&local_208,
                             ")\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(."
                            );
              std::__cxx11::string::substr((ulong)&local_268,(ulong)&i);
              std::operator+(&local_1c8,&local_1e8,&local_268);
              std::operator+(&local_1a8,&local_1c8,"\") to start from the outermost scope.");
              this_local._7_1_ = AddNameError(this,&local_1a8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_268);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_208);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::string::~string((string *)&local_248);
              local_184 = 1;
            }
            else {
              std::operator+(&local_2a8,"Option \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                            );
              std::operator+(&local_288,&local_2a8,"\" unknown.");
              this_local._7_1_ = AddNameError(this,&local_288);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::string::~string((string *)&local_2a8);
              local_184 = 1;
            }
          }
          goto LAB_004ec25e;
        }
        pDVar9 = FieldDescriptor::containing_type
                           ((FieldDescriptor *)
                            intermediate_fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar3 = (int)name_part;
        if (pDVar9 != (Descriptor *)field) {
          pDVar9 = FieldDescriptor::containing_type
                             ((FieldDescriptor *)
                              intermediate_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = get_is_placeholder(pDVar9);
          if (bVar2) {
            AddWithoutInterpreting(this,this->uninterpreted_option_,local_20);
            this_local._7_1_ = 1;
            local_184 = 1;
          }
          else {
            std::operator+(&local_328,"Option field \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
            std::operator+(&local_308,&local_328,"\" is not a field or extension of message \"");
            psVar8 = Descriptor::name_abi_cxx11_((Descriptor *)field);
            std::operator+(&local_2e8,&local_308,psVar8);
            std::operator+(&local_2c8,&local_2e8,"\".");
            this_local._7_1_ = AddNameError(this,&local_2c8);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_328);
            local_184 = 1;
          }
          goto LAB_004ec25e;
        }
        iVar4 = UninterpretedOption::name_size(this->uninterpreted_option_);
        if (iVar3 < iVar4 + -1) {
          CVar5 = FieldDescriptor::cpp_type
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (CVar5 != CPPTYPE_MESSAGE) {
            std::operator+(&local_368,"Option \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
            std::operator+(&local_348,&local_368,"\" is an atomic type, not a message.");
            this_local._7_1_ = AddNameError(this,&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&local_368);
            local_184 = 1;
            goto LAB_004ec25e;
          }
          bVar2 = FieldDescriptor::is_repeated
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            std::operator+(&local_3a8,"Option field \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
            std::operator+(&local_388,&local_3a8,
                           "\" is a repeated message. Repeated message options must be initialized using an aggregate value."
                          );
            this_local._7_1_ = AddNameError(this,&local_388);
            std::__cxx11::string::~string((string *)&local_388);
            std::__cxx11::string::~string((string *)&local_3a8);
            local_184 = 1;
            goto LAB_004ec25e;
          }
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)((long)&debug_msg_name.field_2 + 8),
                      (value_type *)
                      &intermediate_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          field = (FieldDescriptor *)
                  FieldDescriptor::message_type
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      bVar2 = FieldDescriptor::is_repeated
                        ((FieldDescriptor *)
                         intermediate_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_56a = 0;
      if (!bVar2) {
        this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)((long)&debug_msg_name.field_2 + 8);
        local_3b8._M_current =
             (FieldDescriptor **)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(this_00);
        __gnu_cxx::
        __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
        ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                  ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                    *)&local_3b0,&local_3b8);
        unknown_fields.ptr_ =
             (UnknownFieldSet *)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::end(this_00);
        __gnu_cxx::
        __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
        ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                  ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                    *)&local_3c0,
                   (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    *)&unknown_fields);
        ppFVar1 = intermediate_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        iVar3 = (*(local_20->super_MessageLite)._vptr_MessageLite[0x16])();
        pUVar12 = (UnknownFieldSet *)
                  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                            ((long *)CONCAT44(extraout_var,iVar3),local_20);
        bVar2 = ExamineIfOptionIsSet
                          (this,local_3b0,local_3c0,(FieldDescriptor *)ppFVar1,(string *)&i,pUVar12)
        ;
        local_56a = bVar2 ^ 0xff;
      }
      if ((local_56a & 1) == 0) {
        pUVar12 = (UnknownFieldSet *)operator_new(8);
        UnknownFieldSet::UnknownFieldSet(pUVar12);
        internal::scoped_ptr<google::protobuf::UnknownFieldSet>::scoped_ptr
                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter,pUVar12);
        ppFVar1 = intermediate_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::get
                            ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter);
        bVar2 = SetOptionValue(this,(FieldDescriptor *)ppFVar1,pUVar12);
        if (bVar2) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::rbegin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&stack0xfffffffffffffc28);
          while( true ) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::rend((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&parent_unknown_fields);
            bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)&stack0xfffffffffffffc28,
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)&parent_unknown_fields);
            if (!bVar2) break;
            pUVar12 = (UnknownFieldSet *)operator_new(8);
            UnknownFieldSet::UnknownFieldSet(pUVar12);
            internal::scoped_ptr<google::protobuf::UnknownFieldSet>::scoped_ptr
                      ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&outstr.target_,pUVar12);
            ppFVar13 = std::
                       reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                    *)&stack0xfffffffffffffc28);
            TVar6 = FieldDescriptor::type(*ppFVar13);
            if (TVar6 == TYPE_GROUP) {
              pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator->
                                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&outstr.target_)
              ;
              ppFVar13 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                      *)&stack0xfffffffffffffc28);
              iVar3 = FieldDescriptor::number(*ppFVar13);
              pUVar12 = UnknownFieldSet::AddGroup(pUVar12,iVar3);
              pUVar15 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*
                                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter);
              UnknownFieldSet::MergeFrom(pUVar12,pUVar15);
LAB_004ec161:
              pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::release
                                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&outstr.target_)
              ;
              internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset
                        ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter,pUVar12);
              local_184 = 0;
            }
            else {
              if (TVar6 == TYPE_MESSAGE) {
                pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator->
                                    ((scoped_ptr<google::protobuf::UnknownFieldSet> *)
                                     &outstr.target_);
                ppFVar13 = std::
                           reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                        *)&stack0xfffffffffffffc28);
                iVar3 = FieldDescriptor::number(*ppFVar13);
                psVar8 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar12,iVar3);
                io::StringOutputStream::StringOutputStream
                          ((StringOutputStream *)&out.had_error_,psVar8);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_418,(ZeroCopyOutputStream *)&out.had_error_);
                pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*
                                    ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter);
                internal::WireFormat::SerializeUnknownFields(pUVar12,(CodedOutputStream *)local_418)
                ;
                local_451 = 0;
                bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)local_418);
                if (bVar2) {
                  internal::LogMessage::LogMessage
                            (&local_450,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                             ,0x1818);
                  local_451 = 1;
                  pLVar14 = internal::LogMessage::operator<<
                                      (&local_450,"CHECK failed: !out.HadError(): ");
                  pLVar14 = internal::LogMessage::operator<<
                                      (pLVar14,
                                       "Unexpected failure while serializing option submessage ");
                  pLVar14 = internal::LogMessage::operator<<(pLVar14,(string *)&i);
                  pLVar14 = internal::LogMessage::operator<<(pLVar14,"\".");
                  internal::LogFinisher::operator=(&local_452,pLVar14);
                }
                if ((local_451 & 1) != 0) {
                  internal::LogMessage::~LogMessage(&local_450);
                }
                local_184 = 8;
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_418);
                io::StringOutputStream::~StringOutputStream((StringOutputStream *)&out.had_error_);
                goto LAB_004ec161;
              }
              internal::LogMessage::LogMessage
                        (&local_490,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x1825);
              pLVar14 = internal::LogMessage::operator<<
                                  (&local_490,"Invalid wire type for CPPTYPE_MESSAGE: ");
              ppFVar13 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                      *)&stack0xfffffffffffffc28);
              TVar6 = FieldDescriptor::type(*ppFVar13);
              pLVar14 = internal::LogMessage::operator<<(pLVar14,TVar6);
              internal::LogFinisher::operator=(&local_491,pLVar14);
              internal::LogMessage::~LogMessage(&local_490);
              this_local._7_1_ = 0;
              local_184 = 1;
            }
            internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
                      ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&outstr.target_);
            if (local_184 != 0) goto LAB_004ec242;
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          *)&stack0xfffffffffffffc28);
          }
          iVar3 = (*(local_20->super_MessageLite)._vptr_MessageLite[0x16])();
          pUVar12 = (UnknownFieldSet *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                              ((long *)CONCAT44(extraout_var_00,iVar3),local_20);
          pUVar15 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*
                              ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter);
          UnknownFieldSet::MergeFrom(pUVar12,pUVar15);
          this_local._7_1_ = 1;
          local_184 = 1;
        }
        else {
          this_local._7_1_ = 0;
          local_184 = 1;
        }
LAB_004ec242:
        internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&iter);
      }
      else {
        this_local._7_1_ = 0;
        local_184 = 1;
      }
LAB_004ec25e:
      std::__cxx11::string::~string((string *)&i);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)&debug_msg_name.field_2 + 8));
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError("Option must not use reserved name "
                        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = NULL;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the
  // file we're currently building. The descriptor should be there as long as
  // the file we're building imported "google/protobuf/descriptors.proto".

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
    options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = NULL;
  std::vector<const FieldDescriptor*> intermediate_fields;
  string debug_msg_name = "";

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol = builder_->LookupSymbol(name_part,
                                      options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == NULL) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError("Option \"" + debug_msg_name + "\" unknown.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else if (i < uninterpreted_option_->name_size() - 1) {
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        return AddNameError("Option \"" +  debug_msg_name +
                            "\" is an atomic type, not a message.");
      } else if (field->is_repeated()) {
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is a repeated message. Repeated message "
                            "options must be initialized using an "
                            "aggregate value.");
      } else {
        // Drill down into the submessage.
        intermediate_fields.push_back(field);
        descriptor = field->message_type();
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() && !ExamineIfOptionIsSet(
          intermediate_fields.begin(),
          intermediate_fields.end(),
          field, debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }


  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  google::protobuf::scoped_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    google::protobuf::scoped_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
         parent_unknown_fields->AddGroup((*iter)->number())
                              ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  return true;
}